

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this)

{
  Syntax SVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  
  SVar1 = this->style->syntax;
  if (SVar1 == MOIRA_MIT) {
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = '%';
  }
  else {
    cVar3 = 'c';
    cVar4 = 'f';
    cVar5 = 's';
    if (SVar1 == GNU) goto LAB_00131194;
    if (SVar1 == GNU_MIT) {
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = '%';
      goto LAB_00131194;
    }
  }
  cVar3 = 'C';
  cVar4 = 'F';
  cVar5 = 'S';
LAB_00131194:
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = cVar5;
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = cVar4;
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = cVar3;
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Sfc _)
{
    switch (style.syntax) {

        case Syntax::GNU_MIT:      *ptr++ = '%'; [[fallthrough]];
       case Syntax::GNU:          *ptr++ = 's'; *ptr++ = 'f'; *ptr++ = 'c'; break;
        case Syntax::MOIRA_MIT:    *ptr++ = '%'; [[fallthrough]];
        
        default:
            *ptr++ = 'S'; *ptr++ = 'F'; *ptr++ = 'C'; break;
    }

    return *this;
}